

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::find<kj::StringPtr,char_const(&)[4]>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,char (*params) [7])

{
  void *__s1;
  size_t __n;
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  char *in_R8;
  Maybe<unsigned_long> MVar6;
  Iterator iter;
  Iterator local_70;
  size_t local_58;
  char (*local_50) [7];
  SearchKey local_48;
  StringPtr *local_40;
  size_t *local_38;
  
  local_58 = table.size_;
  local_40 = table.ptr;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236900;
  local_50 = params;
  _::BTreeImpl::search(&local_70,(BTreeImpl *)&(local_40->content).size_,&local_48);
  uVar2 = (ulong)local_70.row;
  aVar5 = extraout_RDX;
  if ((uVar2 != 0xe) && ((local_70.leaf)->rows[uVar2].i != 0)) {
    uVar2 = (ulong)((local_70.leaf)->rows[uVar2].i - 1);
    lVar4 = uVar2 * 0x10;
    __s1 = *(void **)(local_58 + lVar4);
    __n = *(size_t *)(local_58 + 8 + lVar4);
    sVar3 = strlen(in_R8);
    aVar5 = extraout_RDX_00;
    if (__n == sVar3 + 1) {
      if (__n != 0) {
        iVar1 = bcmp(__s1,in_R8,__n);
        aVar5 = extraout_RDX_01;
        if (iVar1 != 0) goto LAB_0016a1f2;
      }
      *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1;
      *(ulong *)(this + 8) = uVar2;
      goto LAB_0016a1f5;
    }
  }
LAB_0016a1f2:
  *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x0;
LAB_0016a1f5:
  MVar6.ptr.field_1.value = aVar5.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }